

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

bool read_from_descriptor(DESCRIPTOR_DATA *d)

{
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  int iVar1;
  uint uVar2;
  size_t sVar3;
  ssize_t sVar4;
  int *piVar5;
  long in_RDI;
  int nRead;
  uint iStart;
  char *in_stack_ffffffffffffffb8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar6;
  
  if (*(char *)(in_RDI + 0x4835) == '\0') {
    sVar3 = strlen((char *)(in_RDI + 0x35));
    uVar2 = (uint)sVar3;
    if (uVar2 < 0x47f6) {
      while( true ) {
        sVar4 = read((int)*(short *)(in_RDI + 0x30),(void *)(in_RDI + 0x35 + (ulong)uVar2),
                     0x47f6 - (ulong)uVar2);
        iVar1 = (int)sVar4;
        if (iVar1 < 1) break;
        uVar2 = iVar1 + uVar2;
        if ((*(char *)(in_RDI + 0x35 + (ulong)(uVar2 - 1)) == '\n') ||
           (*(char *)(in_RDI + 0x35 + (ulong)(uVar2 - 1)) == '\r')) goto LAB_005a6a2c;
      }
      if (iVar1 == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        fmt._M_str._0_4_ = in_stack_ffffffffffffffe0;
        fmt._M_len = (size_t)in_stack_ffffffffffffffd8;
        fmt._M_str._4_4_ = in_stack_ffffffffffffffe4;
        CLogger::Info<>((CLogger *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),fmt);
        return false;
      }
      piVar5 = __errno_location();
      if (*piVar5 != 0xb) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        piVar5 = __errno_location();
        strerror(*piVar5);
        fmt_01._M_str._0_7_ = in_stack_fffffffffffffff8;
        fmt_01._M_len = in_RDI;
        fmt_01._M_str._7_1_ = in_stack_ffffffffffffffff;
        CLogger::Warn<char*>
                  ((CLogger *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),fmt_01,
                   (char **)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
        return false;
      }
LAB_005a6a2c:
      *(undefined1 *)(in_RDI + 0x35 + (ulong)uVar2) = 0;
      bVar6 = true;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      fmt_00._M_str._0_7_ = in_stack_fffffffffffffff8;
      fmt_00._M_len = in_RDI;
      fmt_00._M_str._7_1_ = in_stack_ffffffffffffffff;
      CLogger::Info<char*&>
                ((CLogger *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),fmt_00,
                 (char **)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      write_to_descriptor(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                          in_stack_ffffffffffffffd4);
      bVar6 = false;
    }
  }
  else {
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool read_from_descriptor(DESCRIPTOR_DATA *d)
{
	unsigned int iStart;

	/* Hold horses if pending command already. */
	if (d->incomm[0] != '\0')
		return true;

	/* Check for overflow. */
	iStart = strlen(d->inbuf);
	if (iStart >= sizeof(d->inbuf) - 10)
	{
		RS.Logger.Info("{} input overflow!", d->host);

		write_to_descriptor(d->descriptor, "\n\r*** PUT A LID ON IT!!! ***\n\r", 0);
		return false;
	}

	for (;;)
	{
		int nRead = read(d->descriptor, d->inbuf + iStart, sizeof(d->inbuf) - 10 - iStart);

		if (nRead > 0)
		{
			iStart += nRead;

			if (d->inbuf[iStart - 1] == '\n' || d->inbuf[iStart - 1] == '\r')
				break;
		}
		else if (nRead == 0)
		{
			RS.Logger.Info("EOF encountered on read.");
			return false;
		}
		else if (errno == EAGAIN)
		{
			break;
		}
		else
		{
			RS.Logger.Warn("Init_descriptor: read: {}", std::strerror(errno));
			return false;
		}
	}

	d->inbuf[iStart] = '\0';
	return true;
}